

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndp.h
# Opt level: O0

void __thiscall libDAI::NDP::NDP(NDP *this)

{
  undefined8 *in_RDI;
  DAIAlg<libDAI::FactorGraph> *unaff_retaddr;
  
  DAIAlg<libDAI::FactorGraph>::DAIAlg(unaff_retaddr);
  *in_RDI = &PTR_clone_00d4e900;
  memset(in_RDI + 0x23,0,8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xbba4cf);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::vector
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)0xbba4e0)
  ;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)0xbba4f1);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)0xbba502);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)0xbba513);
  in_RDI[0x35] = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xbba52f);
  in_RDI[0x3a] = 1;
  std::__cxx11::
  list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::list((list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          *)0xbba54b);
  in_RDI[0x3e] = 0xffefffffffffffff;
  return;
}

Assistant:

NDP() : 
                DAIAlgFG(), 
                Props(), 
                //_maxdiff(0.0), 
                //_iterations(0UL), 
                //_indices(),
                //_messages(), 
                //_newmessages(), 
                _g(NULL),
                _k(1),
                _k_th_Val(-DBL_MAX) //,  
                //writeAnyTimeResults(false),  
                //results_f(NULL), 
                //timings_f(NULL)
            {}